

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::XMLReader::getName(XMLReader *this,XMLBuffer *toFill,bool token)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  XMLSize_t XVar4;
  ulong uVar5;
  
  uVar5 = this->fCharIndex;
  if (uVar5 == this->fCharsAvail) {
    bVar1 = refreshCharBuffer(this);
    if (!bVar1) {
      return false;
    }
    uVar5 = this->fCharIndex;
  }
  uVar3 = uVar5;
  if (!token) {
    if ((ushort)(this->fCharBuf[uVar5] + L'⠀') < 0x380) {
      XVar4 = uVar5 + 1;
      if (XVar4 == this->fCharsAvail) {
        bVar1 = refreshCharBuffer(this);
        if (!bVar1) {
          return false;
        }
        uVar5 = this->fCharIndex;
        XVar4 = uVar5 + 1;
      }
      if ((ushort)(this->fCharBuf[XVar4] + L'\x2000') < 0xfc00) {
        return false;
      }
      uVar2 = uVar5 + 2;
      uVar3 = uVar5;
    }
    else {
      if ((this->fgCharCharsTable[(ushort)this->fCharBuf[uVar5]] & 2) == 0) {
        return false;
      }
      uVar2 = uVar5 + 1;
    }
    this->fCharIndex = uVar2;
    uVar5 = uVar2;
  }
  do {
    while (this->fCharsAvail <= uVar5) {
LAB_002bf388:
      XVar4 = uVar5 - uVar3;
      if (XVar4 != 0) {
        this->fCurCol = this->fCurCol + XVar4;
        XMLBuffer::append(toFill,this->fCharBuf + uVar3,XVar4);
        uVar5 = this->fCharIndex;
      }
      if ((uVar5 < this->fCharsAvail) || (bVar1 = refreshCharBuffer(this), !bVar1)) {
        return toFill->fIndex != 0;
      }
      uVar3 = this->fCharIndex;
      uVar5 = this->fCharIndex;
    }
    if ((ushort)(this->fCharBuf[uVar5] + L'⠀') < 0x380) {
      uVar2 = uVar5 + 1;
      if (uVar2 == this->fCharsAvail) {
        XVar4 = uVar5 - uVar3;
        if (XVar4 != 0) {
          this->fCurCol = this->fCurCol + XVar4;
          XMLBuffer::append(toFill,this->fCharBuf + uVar3,XVar4);
        }
        bVar1 = refreshCharBuffer(this);
        uVar5 = this->fCharIndex;
        if (!bVar1) goto LAB_002bf388;
        uVar2 = uVar5 + 1;
        uVar3 = uVar5;
      }
      if ((ushort)(this->fCharBuf[uVar2] + L'\x2000') < 0xfc00) goto LAB_002bf388;
      uVar5 = uVar5 + 2;
    }
    else {
      if ((this->fgCharCharsTable[(ushort)this->fCharBuf[uVar5]] & 4) == 0) goto LAB_002bf388;
      uVar5 = uVar5 + 1;
    }
    this->fCharIndex = uVar5;
  } while( true );
}

Assistant:

bool XMLReader::getName(XMLBuffer& toFill, const bool token)
{
    //  Ok, first lets see if we have chars in the buffer. If not, then lets
    //  reload.
    if (fCharIndex == fCharsAvail)
    {
        if (!refreshCharBuffer())
            return false;
    }

    XMLSize_t charIndex_start = fCharIndex;

    //  Lets check the first char for being a first name char. If not, then
    //  what's the point in living mannnn? Just give up now. We only do this
    //  if its a name and not a name token that they want.
    if (!token)
    {
        if ((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F)) {
            // if there isn't one more char in the buffer, read more data
            if (fCharIndex+1 == fCharsAvail)
            {
                if (!refreshCharBuffer())
                    return false;
                // reset the start buffer to the new location of the cursor
                charIndex_start = fCharIndex;
            }
            if ((fCharBuf[fCharIndex+1] < 0xDC00) || (fCharBuf[fCharIndex+1] > 0xDFFF))
                return false;

            // Looks ok, so lets eat it
            fCharIndex += 2;
        }
        else {
            if (!isFirstNameChar(fCharBuf[fCharIndex]))
                return false;

            // Looks ok, so lets eat it
            fCharIndex ++;
        }

    }

    //  And now we loop until we run out of data in this reader or we hit
    //  a non-name char.
    while (true)
    {
        while (fCharIndex < fCharsAvail)
        {
            //  Check the current char and take it if its a name char. Else
            //  break out.
            if ( (fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F) )
            {
                // if there isn't one more char in the buffer, read more data
                if (fCharIndex+1 == fCharsAvail)
                {
                    // but first copy the accepted character(s), and update column
                    if (fCharIndex != charIndex_start)
                    {
                        fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
                        toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
                    }

                    if (!refreshCharBuffer())
                        break;

                    charIndex_start = fCharIndex;
                }
                if ( (fCharBuf[fCharIndex+1] < 0xDC00) ||
                        (fCharBuf[fCharIndex+1] > 0xDFFF)  )
                    break;
                fCharIndex += 2;

            }
            else
            {
                if (!isNameChar(fCharBuf[fCharIndex]))
                    break;
                fCharIndex++;
            }
        }

        // we have to copy the accepted character(s), and update column
        if (fCharIndex != charIndex_start)
        {
            fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
            toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
        }

        // something is wrong if there is still something in the buffer
        // or if we don't get no more, then break out.
        if ((fCharIndex < fCharsAvail) ||
             !refreshCharBuffer())
            break;

        charIndex_start = fCharIndex;
    }

    return !toFill.isEmpty();
}